

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestOstreamBuffer.cpp
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_1e5ebb::TestcaseBase::toString<bool>(TestcaseBase *this,bool t)

{
  byte in_DL;
  TestcaseBase *in_RSI;
  string *in_RDI;
  string *s;
  string local_38 [38];
  undefined1 local_12;
  byte local_11;
  
  local_11 = in_DL & 1;
  binlog::detail::OstreamBuffer::operator<<((OstreamBuffer *)in_RSI,SUB81((ulong)in_RDI >> 0x38,0));
  local_12 = 0;
  (anonymous_namespace)::TestcaseBase::result_abi_cxx11_(in_RSI);
  std::__cxx11::string::string(local_38);
  std::__cxx11::ostringstream::str((string *)in_RSI);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

std::string toString(T t)
  {
    buf << t;
    std::string s = result();
    str.str({}); // clear ostream
    return s;
  }